

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

void __thiscall
IO::momentsNicking(IO *this,vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims,
                  string *filename)

{
  pointer ppMVar1;
  ModelInstance *pMVar2;
  ostream *poVar3;
  pointer ppMVar4;
  ofstream outstream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
  ppMVar1 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar4 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppMVar4 != ppMVar1; ppMVar4 = ppMVar4 + 1
      ) {
    pMVar2 = *ppMVar4;
    poVar3 = std::ostream::_M_insert<double>((double)pMVar2->nick1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>((double)pMVar2->nick2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void IO::momentsNicking(std::vector<ModelInstance*> sims, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (ModelInstance* model: sims){
		outstream << model->nick1 << "\t" << model->nick2 << std::endl;
	}
	outstream.close();
}